

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

iterator __thiscall
slang::SmallVectorBase<(anonymous_namespace)::Constructable>::insert
          (SmallVectorBase<(anonymous_namespace)::Constructable> *this,const_iterator pos,
          Constructable *val)

{
  undefined8 in_RAX;
  pointer pCVar1;
  Constructable *pCVar2;
  Constructable temp;
  Constructable local_18;
  
  if (this->len == this->cap) {
    pCVar1 = emplaceRealloc<(anonymous_namespace)::Constructable_const&>(this,pos,val);
    return pCVar1;
  }
  pCVar2 = this->data_ + this->len;
  if (pCVar2 == pos) {
    anon_unknown.dwarf_965823::Constructable::Constructable(pCVar2,val);
    this->len = this->len + 1;
  }
  else {
    local_18._1_7_ = SUB87((ulong)in_RAX >> 8,0);
    local_18.constructed = true;
    local_18.value = val->value;
    (anonymous_namespace)::Constructable::numConstructorCalls =
         (anonymous_namespace)::Constructable::numConstructorCalls + 1;
    (anonymous_namespace)::Constructable::numCopyConstructorCalls =
         (anonymous_namespace)::Constructable::numCopyConstructorCalls + 1;
    anon_unknown.dwarf_965823::Constructable::Constructable(pCVar2,pCVar2 + -1);
    pCVar2 = (Constructable *)this->len;
    std::ranges::__move_backward_fn::
    operator()<(anonymous_namespace)::Constructable_*,_(anonymous_namespace)::Constructable_*,_(anonymous_namespace)::Constructable_*>
              ((__move_backward_fn *)pos,this->data_ + (long)((long)&pCVar2[-1].value + 3),
               this->data_ + (long)pCVar2,pCVar2);
    anon_unknown.dwarf_965823::Constructable::operator=(pos,&local_18);
    this->len = this->len + 1;
    anon_unknown.dwarf_965823::Constructable::~Constructable(&local_18);
  }
  return pos;
}

Assistant:

iterator insert(const_iterator pos, const T& val) { return emplace(pos, val); }